

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localServer.c
# Opt level: O0

DNSBody * queryFromServer(int socket_handler,DNSQuery *dnsQuery,char *dns_server)

{
  DNSBody dnsBody;
  int iVar1;
  time_t tVar2;
  char *__buf;
  ssize_t sVar3;
  socklen_t local_490;
  int local_48c;
  socklen_t len;
  int ret;
  char buf [1024];
  char *serResponse;
  size_t queryLength;
  DNSBody query;
  int query_length;
  in_addr_t iStack_34;
  unsigned_short usId;
  sockaddr_in dns_server_address;
  char *dns_server_local;
  DNSQuery *dnsQuery_local;
  DNSBody *pDStack_10;
  int socket_handler_local;
  
  dns_server_address.sin_zero = (uchar  [8])dns_server;
  memset(&query_length,0,0x10);
  query_length._0_2_ = 2;
  query_length._2_2_ = htons(0x35);
  iStack_34 = inet_addr((char *)dns_server_address.sin_zero);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  iVar1 = rand();
  query.additional._6_2_ = (undefined2)iVar1;
  memset(&queryLength,0,0x30);
  memset(&queryLength,0,0xc);
  queryLength._4_2_ = 1;
  dnsBody.dnsHeader.Questions = 1;
  dnsBody.dnsHeader._0_4_ =
       CONCAT22(queryLength._2_2_,(undefined2)queryLength) & 0xff7effff | 0x10000;
  dnsBody.dnsHeader.AnswerRRs = queryLength._6_2_;
  dnsBody.dnsHeader.AuthorityRRs = query.dnsHeader.usTransID;
  dnsBody.dnsHeader.AdditionalRRs = query.dnsHeader._2_2_;
  dnsBody._12_2_ = query.dnsHeader.Questions;
  dnsBody._14_2_ = query.dnsHeader.AnswerRRs;
  dnsBody.query = dnsQuery;
  dnsBody.answer = (DNSRr *)query.query;
  dnsBody.authority = query.answer;
  dnsBody.additional = query.authority;
  queryLength._2_2_ = queryLength._2_2_ & 0xff7e | 1;
  query._8_8_ = dnsQuery;
  __buf = serilizeDNS(dnsBody,(size_t *)&serResponse);
  sVar3 = sendto(socket_handler,__buf,(size_t)serResponse,0,(sockaddr *)&query_length,0x10);
  if (sVar3 < 1) {
    perror("Send dns package");
  }
  free(__buf);
  local_490 = 0x10;
  sVar3 = recvfrom(socket_handler,&len,0x400,0,(sockaddr *)&query_length,&local_490);
  local_48c = (int)sVar3;
  if (local_48c < 1) {
    perror("receive socket");
    pDStack_10 = (DNSBody *)0x0;
  }
  else {
    pDStack_10 = deserializeDNS((char *)&len,(long)local_48c);
  }
  return pDStack_10;
}

Assistant:

DNSBody *queryFromServer(int socket_handler, DNSQuery *dnsQuery, char *dns_server)
{
    struct sockaddr_in dns_server_address = {};
    dns_server_address.sin_family = AF_INET;
    dns_server_address.sin_port = htons(DNS_PORT);  // DNS 53
    dns_server_address.sin_addr.s_addr = inet_addr(dns_server);

    srand((unsigned int) time(NULL));
    unsigned short usId = (unsigned short) rand();

    int query_length;


    DNSBody query;
    memset(&query, 0, sizeof(DNSBody));
    memset(&query.dnsHeader, 0, sizeof(DNSHeader));

    query.dnsHeader.QR = 0;
    query.dnsHeader.Questions = 1;
    query.dnsHeader.RD = 1;
    query.query = dnsQuery;

    size_t queryLength;
    char *serResponse = serilizeDNS(query, &queryLength);

    if (sendto(socket_handler,
               serResponse,
               queryLength,
               0,
               (struct sockaddr *) &dns_server_address,
               sizeof(dns_server_address)) < 1
            )
    {
        perror("Send dns package");
    }

    free(serResponse);
//    releaseDNS(query);


    //recv
    char buf[BUF_SIZE];

    int ret;
    socklen_t len = sizeof(dns_server_address);
    if ((ret = recvfrom(socket_handler,
                        buf,
                        BUF_SIZE,
                        0,
                        (struct sockaddr *) &dns_server_address,
                        (socklen_t *) &len)) < 1)
    {
        perror("receive socket");
        return NULL;
    }

    return deserializeDNS(buf, ret);


}